

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

Gia_Man_t * Gia_ManEquivReduce2(Gia_Man_t *p)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *p_00;
  char *pcVar5;
  void *__s;
  Gia_Rpr_t *pGVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  int iVar11;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    if (p->pSibls != (int *)0x0) {
      uVar1 = p->nObjs;
      __size = (long)(int)uVar1 * 4;
      __s = malloc(__size);
      memset(__s,0xff,__size);
      pGVar6 = (Gia_Rpr_t *)calloc((long)(int)uVar1,4);
      p->pReprs = pGVar6;
      for (lVar7 = 0; lVar7 < (int)uVar1; lVar7 = lVar7 + 1) {
        p->pReprs[lVar7] = (Gia_Rpr_t)((uint)p->pReprs[lVar7] | 0xfffffff);
        uVar1 = p->nObjs;
      }
      uVar8 = 0;
      uVar10 = 0;
      if (0 < (int)uVar1) {
        uVar10 = (ulong)uVar1;
      }
      for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        iVar11 = p->pSibls[uVar8];
        lVar7 = (long)iVar11;
        if (0 < lVar7) {
          iVar2 = *(int *)((long)__s + lVar7 * 4);
          if (iVar2 == -1) {
            *(int *)((long)__s + lVar7 * 4) = iVar11;
            iVar2 = iVar11;
          }
          *(int *)((long)__s + uVar8 * 4) = iVar2;
        }
      }
      for (lVar7 = 0; lVar7 < (int)uVar1; lVar7 = lVar7 + 1) {
        if (0 < p->pSibls[lVar7]) {
          Gia_ObjSetRepr(p,(int)lVar7,*(int *)((long)__s + lVar7 * 4));
          uVar1 = p->nObjs;
        }
      }
      if (p->pNexts != (int *)0x0) {
        free(p->pNexts);
        p->pNexts = (int *)0x0;
      }
      piVar9 = Gia_ManDeriveNexts(p);
      p->pNexts = piVar9;
      free(__s);
      if (p->pReprs != (Gia_Rpr_t *)0x0) goto LAB_001e5e29;
    }
    pGVar4 = (Gia_Man_t *)0x0;
    Abc_Print(1,"Gia_ManEquivReduce(): Equivalence classes are not available.\n");
  }
  else {
LAB_001e5e29:
    for (iVar11 = 0; iVar11 < p->nObjs; iVar11 = iVar11 + 1) {
      pGVar3 = Gia_ManObj(p,iVar11);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar3 = Gia_ObjReprObj(p,iVar11);
      if (pGVar3 != (Gia_Obj_t *)0x0) break;
    }
    if (p->nObjs == iVar11) {
      pGVar4 = Gia_ManDup(p);
      return pGVar4;
    }
    p_00 = Gia_ManChoiceMinLevel(p);
    Gia_ManSetPhase(p);
    pGVar4 = Gia_ManStart(p->nObjs);
    pcVar5 = Abc_UtilStrsav(p->pName);
    pGVar4->pName = pcVar5;
    pcVar5 = Abc_UtilStrsav(p->pSpec);
    pGVar4->pSpec = pcVar5;
    Gia_ManFillValue(p);
    p->pObjs->Value = 0;
    for (iVar11 = 0; iVar11 < p->vCis->nSize; iVar11 = iVar11 + 1) {
      pGVar3 = Gia_ManCi(p,iVar11);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar1 = Gia_ManAppendCi(pGVar4);
      pGVar3->Value = uVar1;
    }
    Gia_ManHashAlloc(pGVar4);
    for (iVar11 = 0; iVar11 < p->vCos->nSize; iVar11 = iVar11 + 1) {
      pGVar3 = Gia_ManCo(p,iVar11);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      Gia_ManEquivReduce2_rec
                (pGVar4,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff),p_00,1);
    }
    for (iVar11 = 0; iVar11 < p->vCos->nSize; iVar11 = iVar11 + 1) {
      pGVar3 = Gia_ManCo(p,iVar11);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ObjFanin0Copy(pGVar3);
      uVar1 = Gia_ManAppendCo(pGVar4,iVar2);
      pGVar3->Value = uVar1;
    }
    Gia_ManHashStop(pGVar4);
    Gia_ManSetRegNum(pGVar4,p->nRegs);
    Vec_IntFree(p_00);
  }
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManEquivReduce2( Gia_Man_t * p )
{
    Vec_Int_t * vMap;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    if ( !p->pReprs && p->pSibls )
    {
        int * pMap = ABC_FALLOC( int, Gia_ManObjNum(p) );
        p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Gia_ObjSetRepr( p, i, GIA_VOID );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
            {
                if ( pMap[p->pSibls[i]] == -1 )
                    pMap[p->pSibls[i]] = p->pSibls[i];
                pMap[i] = pMap[p->pSibls[i]];
            }
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
                Gia_ObjSetRepr( p, i, pMap[i] );
        //printf( "Created equivalence classes.\n" );
        ABC_FREE( p->pNexts );
        p->pNexts = Gia_ManDeriveNexts( p );
        ABC_FREE( pMap );
    }
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManEquivReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    // check if there are any equivalences defined
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjReprObj(p, i) != NULL )
            break;
    if ( i == Gia_ManObjNum(p) )
        return Gia_ManDup( p );
    vMap = Gia_ManChoiceMinLevel( p );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManEquivReduce2_rec( pNew, p, Gia_ObjFanin0(pObj), vMap, 1 );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vMap );
    return pNew;
}